

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

XMLContentModel * __thiscall xercesc_4_0::DTDElementDecl::createChildModel(DTDElementDecl *this)

{
  int iVar1;
  uint uVar2;
  NodeTypes NVar3;
  undefined4 extraout_var;
  RuntimeException *pRVar4;
  MemoryManager *pMVar5;
  QName *pQVar6;
  ContentSpecNode *pCVar7;
  SimpleContentModel *pSVar8;
  QName *secondChild;
  undefined4 extraout_var_00;
  ContentSpecNode *specNode;
  DTDElementDecl *this_local;
  ContentSpecNode *this_00;
  
  iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])();
  this_00 = (ContentSpecNode *)CONCAT44(extraout_var,iVar1);
  if (this_00 == (ContentSpecNode *)0x0) {
    pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
    pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    RuntimeException::RuntimeException
              (pRVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
               ,0x118,CM_UnknownCMSpecType,pMVar5);
    __cxa_throw(pRVar4,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  pQVar6 = ContentSpecNode::getElement(this_00);
  if (pQVar6 != (QName *)0x0) {
    pQVar6 = ContentSpecNode::getElement(this_00);
    uVar2 = QName::getURI(pQVar6);
    if (uVar2 == 0xffffffff) {
      pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
      pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
      RuntimeException::RuntimeException
                (pRVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
                 ,0x120,CM_NoPCDATAHere,pMVar5);
      __cxa_throw(pRVar4,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
  }
  NVar3 = ContentSpecNode::getType(this_00);
  if (NVar3 == Leaf) {
    pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    this_local = (DTDElementDecl *)XMemory::operator_new(0x28,pMVar5);
    pQVar6 = ContentSpecNode::getElement(this_00);
    pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    SimpleContentModel::SimpleContentModel
              ((SimpleContentModel *)this_local,true,pQVar6,(QName *)0x0,Leaf,pMVar5);
  }
  else {
    NVar3 = ContentSpecNode::getType(this_00);
    if ((NVar3 == Choice) || (NVar3 = ContentSpecNode::getType(this_00), NVar3 == Sequence)) {
      pCVar7 = ContentSpecNode::getFirst(this_00);
      NVar3 = ContentSpecNode::getType(pCVar7);
      if (NVar3 == Leaf) {
        pCVar7 = ContentSpecNode::getSecond(this_00);
        NVar3 = ContentSpecNode::getType(pCVar7);
        if (NVar3 == Leaf) {
          pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
          pSVar8 = (SimpleContentModel *)XMemory::operator_new(0x28,pMVar5);
          pCVar7 = ContentSpecNode::getFirst(this_00);
          pQVar6 = ContentSpecNode::getElement(pCVar7);
          pCVar7 = ContentSpecNode::getSecond(this_00);
          secondChild = ContentSpecNode::getElement(pCVar7);
          NVar3 = ContentSpecNode::getType(this_00);
          pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
          SimpleContentModel::SimpleContentModel(pSVar8,true,pQVar6,secondChild,NVar3,pMVar5);
          return &pSVar8->super_XMLContentModel;
        }
      }
    }
    else {
      NVar3 = ContentSpecNode::getType(this_00);
      if (((NVar3 != OneOrMore) && (NVar3 = ContentSpecNode::getType(this_00), NVar3 != ZeroOrMore))
         && (NVar3 = ContentSpecNode::getType(this_00), NVar3 != ZeroOrOne)) {
        pRVar4 = (RuntimeException *)__cxa_allocate_exception(0x30);
        pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
        RuntimeException::RuntimeException
                  (pRVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDElementDecl.cpp"
                   ,0x15e,CM_UnknownCMSpecType,pMVar5);
        __cxa_throw(pRVar4,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      pCVar7 = ContentSpecNode::getFirst(this_00);
      NVar3 = ContentSpecNode::getType(pCVar7);
      if (NVar3 == Leaf) {
        pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
        pSVar8 = (SimpleContentModel *)XMemory::operator_new(0x28,pMVar5);
        pCVar7 = ContentSpecNode::getFirst(this_00);
        pQVar6 = ContentSpecNode::getElement(pCVar7);
        NVar3 = ContentSpecNode::getType(this_00);
        pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
        SimpleContentModel::SimpleContentModel(pSVar8,true,pQVar6,(QName *)0x0,NVar3,pMVar5);
        return &pSVar8->super_XMLContentModel;
      }
    }
    pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    this_local = (DTDElementDecl *)XMemory::operator_new(0x88,pMVar5);
    iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[9])();
    pMVar5 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    DFAContentModel::DFAContentModel
              ((DFAContentModel *)this_local,true,(ContentSpecNode *)CONCAT44(extraout_var_00,iVar1)
               ,pMVar5);
  }
  return (XMLContentModel *)this_local;
}

Assistant:

XMLContentModel* DTDElementDecl::createChildModel()
{
    // Get the content spec node of the element
    ContentSpecNode* specNode = getContentSpec();

    if(!specNode)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());

    //
    //  Do a sanity check that the node does not have a PCDATA id. Since,
    //  if it was, it should have already gotten taken by the Mixed model.
    //
    if (specNode->getElement()) {
        if (specNode->getElement()->getURI() == XMLElementDecl::fgPCDataElemId)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_NoPCDATAHere, getMemoryManager());
    }

    //
    //  According to the type of node, we will create the correct type of
    //  content model.
    //
    if (specNode->getType() == ContentSpecNode::Leaf)
    {
        // Create a simple content model
        return new (getMemoryManager()) SimpleContentModel
        (
            true
            , specNode->getElement()
            , 0
            , ContentSpecNode::Leaf
            , getMemoryManager()
        );
    }
     else if ((specNode->getType() == ContentSpecNode::Choice)
          ||  (specNode->getType() == ContentSpecNode::Sequence))
    {
        //
        //  Lets see if both of the children are leafs. If so, then it has to
        //  be a simple content model
        //
        if ((specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        &&  (specNode->getSecond()->getType() == ContentSpecNode::Leaf))
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , specNode->getSecond()->getElement()
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else if ((specNode->getType() == ContentSpecNode::OneOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrMore)
          ||  (specNode->getType() == ContentSpecNode::ZeroOrOne))
    {
        //
        //  Its a repetition, so see if its one child is a leaf. If so its a
        //  repetition of a single element, so we can do a simple content
        //  model for that.
        //
        if (specNode->getFirst()->getType() == ContentSpecNode::Leaf)
        {
            return new (getMemoryManager()) SimpleContentModel
            (
                true
                , specNode->getFirst()->getElement()
                , 0
                , specNode->getType()
                , getMemoryManager()
            );
        }
    }
     else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::CM_UnknownCMSpecType, getMemoryManager());
    }

    // Its not any simple type of content, so create a DFA based content model
    return new (getMemoryManager()) DFAContentModel
    (
        true
        , this->getContentSpec()
        , getMemoryManager()
    );
}